

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O2

__int128 * __thiscall
calculator::ExpressionParser<__int128>::parseValue
          (__int128 *__return_storage_ptr__,ExpressionParser<__int128> *this)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  __int128 *p_Var4;
  error *peVar5;
  allocator<char> local_41;
  string local_40;
  
  eatSpaces((ExpressionParser<__int128> *)__return_storage_ptr__);
  uVar2 = *(ulong *)(__return_storage_ptr__ + 2);
  if (uVar2 < *(ulong *)((long)__return_storage_ptr__ + 8)) {
    cVar1 = *(char *)((long)*__return_storage_ptr__ + uVar2);
    switch(cVar1) {
    case '(':
      *(ulong *)(__return_storage_ptr__ + 2) = uVar2 + 1;
      p_Var4 = parseExpr(__return_storage_ptr__,this);
      eatSpaces((ExpressionParser<__int128> *)__return_storage_ptr__);
      uVar2 = *(ulong *)(__return_storage_ptr__ + 2);
      if (uVar2 < *(ulong *)((long)__return_storage_ptr__ + 8)) {
        if (*(char *)((long)*__return_storage_ptr__ + uVar2) == ')') {
          *(ulong *)(__return_storage_ptr__ + 2) = uVar2 + 1;
          return p_Var4;
        }
        unexpected((ExpressionParser<__int128> *)__return_storage_ptr__);
      }
      peVar5 = (error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Syntax error: `)\' expected at end of expression",&local_41);
      error::error(peVar5,(string *)__return_storage_ptr__,&local_40);
      __cxa_throw(peVar5,&error::typeinfo,error::~error);
    case '+':
      *(ulong *)(__return_storage_ptr__ + 2) = uVar2 + 1;
      p_Var4 = parseValue(__return_storage_ptr__,this);
      break;
    case '-':
      *(ulong *)(__return_storage_ptr__ + 2) = uVar2 + 1;
      p_Var4 = parseValue(__return_storage_ptr__,this);
      p_Var4 = (__int128 *)-(long)p_Var4;
      break;
    case '0':
      bVar3 = isHex((ExpressionParser<__int128> *)__return_storage_ptr__);
      if (bVar3) {
        p_Var4 = parseHex(__return_storage_ptr__,this);
        return p_Var4;
      }
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      p_Var4 = parseDecimal(__return_storage_ptr__,this);
      break;
    default:
      if (cVar1 == '~') {
        *(ulong *)(__return_storage_ptr__ + 2) = uVar2 + 1;
        p_Var4 = parseValue(__return_storage_ptr__,this);
        return (__int128 *)~(ulong)p_Var4;
      }
    case ')':
    case '*':
    case ',':
    case '.':
    case '/':
      unexpected((ExpressionParser<__int128> *)__return_storage_ptr__);
      goto LAB_001147c4;
    }
    return p_Var4;
  }
LAB_001147c4:
  peVar5 = (error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Syntax error: value expected at end of expression",&local_41);
  error::error(peVar5,(string *)__return_storage_ptr__,&local_40);
  __cxa_throw(peVar5,&error::typeinfo,error::~error);
}

Assistant:

T parseValue()
  {
    T val = 0;
    eatSpaces();
    switch (getCharacter())
    {
      case '0': if (isHex())
                  val = parseHex();
                else
                  val = parseDecimal();
                break;
      case '1': case '2': case '3': case '4': case '5':
      case '6': case '7': case '8': case '9':
                val = parseDecimal();
                break;
      case '(': index_++;
                val = parseExpr();
                eatSpaces();
                if (getCharacter() != ')')
                {
                  if (!isEnd())
                    unexpected();
                  throw calculator::error(expr_, "Syntax error: `)' expected at end of expression");
                }
                index_++; break;
      case '~': index_++; val = ~parseValue(); break;
      case '+': index_++; val =  parseValue(); break;
      case '-': index_++; val =  parseValue() * static_cast<T>(-1);
                break;
      default : if (!isEnd())
                  unexpected();
                throw calculator::error(expr_, "Syntax error: value expected at end of expression");
    }
    return val;
  }